

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O3

bool __thiscall
metaf::VisibilityGroup::appendFraction(VisibilityGroup *this,string *group,IncompleteText next)

{
  bool bVar1;
  Modifier MVar2;
  uint uVar3;
  long lVar4;
  optional<metaf::Distance> v;
  _Storage<metaf::Distance,_true> local_34;
  char local_24;
  
  lVar4 = std::__cxx11::string::find((char)group,0x2f);
  if (lVar4 == -1) {
    return false;
  }
  Distance::fromMileString((optional<metaf::Distance> *)&local_34._M_value,group,true);
  if (local_24 == '\x01') {
    bVar1 = (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged;
    MVar2 = (this->vis).distModifier;
    if ((MVar2 - DISTANT < 2 | bVar1) != 1) {
      (this->vis).distModifier = local_34._0_4_;
      (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload =
           (_Storage<unsigned_int,_true>)local_34._4_4_;
      *(ulong *)&(this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_int>._M_engaged =
           CONCAT44(local_34._M_value.distUnit,local_34._8_4_);
LAB_001a79e5:
      this->incompleteText = next;
      return true;
    }
    if (MVar2 < DISTANT) {
      if (local_34._M_value.distModifier != NONE) {
        return false;
      }
      if ((this->vis).distUnit != STATUTE_MILES) {
        return false;
      }
      if (local_34._M_value.distUnit != STATUTE_MILES) {
        return false;
      }
      if ((((bVar1 != false) &&
           (local_34._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_engaged == true)) &&
          (uVar3 = (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                   super__Optional_payload_base<unsigned_int>._M_payload._M_value,
          (uVar3 * 0x3afb7e91 >> 4 | uVar3 * 0x10000000) < 0x68db9)) &&
         (0x68db8 < ((uint)((int)local_34._M_value.dist.
                                 super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_int>._M_payload * 0x3afb7e91)
                     >> 4 | (int)local_34._M_value.dist.
                                 super__Optional_base<unsigned_int,_true,_true>._M_payload.
                                 super__Optional_payload_base<unsigned_int>._M_payload * 0x10000000)
         )) {
        (this->vis).dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_int> =
             (_Optional_payload_base<unsigned_int>)
             ((ulong)((int)local_34._M_value.dist.super__Optional_base<unsigned_int,_true,_true>.
                           _M_payload.super__Optional_payload_base<unsigned_int>._M_payload + uVar3)
             | 0x100000000);
        (this->vis).distUnit = STATUTE_MILES;
        goto LAB_001a79e5;
      }
    }
  }
  return false;
}

Assistant:

bool VisibilityGroup::appendFraction(const std::string & group, IncompleteText next) {
	if (group.find('/') == std::string::npos) return false;
	const auto v = Distance::fromMileString(group, true);
	if (!v.has_value()) return false;
	if (vis.isReported()) {
		const auto d = Distance::fromIntegerAndFraction(vis, std::move(*v));
		if (!d.has_value()) return false;
		vis = std::move(*d);
	} else {
		vis = std::move(*v);
	}
	incompleteText = next;
	return true;
}